

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkTSDA::Initialize
          (ChLinkTSDA *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          bool pos_are_relative,ChVector<double> *loc1,ChVector<double> *loc2)

{
  ChBodyFrame *this_00;
  element_type *peVar1;
  undefined3 in_register_00000009;
  ChBodyFrame *pCVar2;
  double dVar3;
  ChVector<double> v;
  undefined1 local_48 [16];
  double local_38;
  
  peVar1 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &peVar1->super_ChBodyFrame;
  if (peVar1 != (element_type *)0x0) {
    peVar1 = (element_type *)this_00;
  }
  (this->super_ChLink).Body1 = (ChBodyFrame *)peVar1;
  peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar2 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar2 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar2;
  if (CONCAT31(in_register_00000009,pos_are_relative) == 0) {
    ChFrame<double>::TransformPointParentToLocal
              ((ChVector<double> *)local_48,(ChFrame<double> *)this_00,loc1);
    if ((ChVector<double> *)local_48 != &this->m_loc1) {
      (this->m_loc1).m_data[0] = (double)local_48._0_8_;
      (this->m_loc1).m_data[1] = (double)local_48._8_8_;
      (this->m_loc1).m_data[2] = local_38;
    }
    ChFrame<double>::TransformPointParentToLocal
              ((ChVector<double> *)local_48,
               (ChFrame<double> *)
               &((body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ChBodyFrame,loc2);
    if ((ChVector<double> *)local_48 != &this->m_loc2) {
      (this->m_loc2).m_data[0] = (double)local_48._0_8_;
      (this->m_loc2).m_data[1] = (double)local_48._8_8_;
      (this->m_loc2).m_data[2] = local_38;
    }
    if (&this->m_aloc1 != loc1) {
      (this->m_aloc1).m_data[0] = loc1->m_data[0];
      (this->m_aloc1).m_data[1] = loc1->m_data[1];
      (this->m_aloc1).m_data[2] = loc1->m_data[2];
    }
    if (&this->m_aloc2 == loc2) goto LAB_00adce61;
    (this->m_aloc2).m_data[0] = loc2->m_data[0];
    (this->m_aloc2).m_data[1] = loc2->m_data[1];
    local_38 = loc2->m_data[2];
  }
  else {
    if (&this->m_loc1 != loc1) {
      (this->m_loc1).m_data[0] = loc1->m_data[0];
      (this->m_loc1).m_data[1] = loc1->m_data[1];
      (this->m_loc1).m_data[2] = loc1->m_data[2];
    }
    if (&this->m_loc2 != loc2) {
      (this->m_loc2).m_data[0] = loc2->m_data[0];
      (this->m_loc2).m_data[1] = loc2->m_data[1];
      (this->m_loc2).m_data[2] = loc2->m_data[2];
    }
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)local_48,(ChFrame<double> *)this_00,loc1);
    if ((ChVector<double> *)local_48 != &this->m_aloc1) {
      (this->m_aloc1).m_data[0] = (double)local_48._0_8_;
      (this->m_aloc1).m_data[1] = (double)local_48._8_8_;
      (this->m_aloc1).m_data[2] = local_38;
    }
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)local_48,
               (ChFrame<double> *)
               &((body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ChBodyFrame,loc2);
    if ((ChVector<double> *)local_48 == &this->m_aloc2) goto LAB_00adce61;
    (this->m_aloc2).m_data[0] = (double)local_48._0_8_;
    (this->m_aloc2).m_data[1] = (double)local_48._8_8_;
  }
  (this->m_aloc2).m_data[2] = local_38;
LAB_00adce61:
  local_48 = vsubpd_avx(*(undefined1 (*) [16])(this->m_aloc1).m_data,
                        *(undefined1 (*) [16])(this->m_aloc2).m_data);
  local_38 = (this->m_aloc1).m_data[2] - (this->m_aloc2).m_data[2];
  dVar3 = ChVector<double>::Length((ChVector<double> *)local_48);
  this->m_length = dVar3;
  if (this->m_auto_rest_length == true) {
    this->m_rest_length = dVar3;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->m_Qforce).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->m_nstates + 0xc);
  return;
}

Assistant:

void ChLinkTSDA::Initialize(std::shared_ptr<ChBody> body1,
                            std::shared_ptr<ChBody> body2,
                            bool pos_are_relative,
                            ChVector<> loc1,
                            ChVector<> loc2) {
    Body1 = (ChBodyFrame*)body1.get();
    Body2 = (ChBodyFrame*)body2.get();

    if (pos_are_relative) {
        m_loc1 = loc1;
        m_loc2 = loc2;
        m_aloc1 = body1->TransformPointLocalToParent(loc1);
        m_aloc2 = body2->TransformPointLocalToParent(loc2);
    } else {
        m_loc1 = body1->TransformPointParentToLocal(loc1);
        m_loc2 = body2->TransformPointParentToLocal(loc2);
        m_aloc1 = loc1;
        m_aloc2 = loc2;
    }

    m_length = (m_aloc1 - m_aloc2).Length();
    if (m_auto_rest_length)
        m_rest_length = m_length;

    // Set size of forcing term
    m_Qforce.resize(12 + m_nstates);
}